

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

string * __thiscall OB::Parg::get_pos_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  size_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  __str.field_2._8_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)__str.field_2._8_8_;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar3 = (this->positional_vec_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->positional_vec_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      local_58 = &__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + pbVar3->_M_string_length);
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != &__str._M_string_length) {
        operator_delete(local_58,__str._M_string_length + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
    std::__cxx11::string::pop_back();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_pos() const
  {
    std::string str;
    if (positional_vec_.empty())
    {
      return str;
    }
    for (auto const& e : positional_vec_)
    {
      str += e + " ";
    }
    str.pop_back();
    return str;
  }